

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
::
write_int<fmt::v5::basic_format_specs<char>,fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
           *this,uint num_digits,string_view prefix,basic_format_specs<char> *spec,bin_writer<3> f)

{
  ulong uVar1;
  alignment aVar2;
  int iVar3;
  ulong uVar4;
  size_t size;
  align_spec as;
  align_spec local_48;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>::int_writer<unsigned_int,_fmt::v5::basic_format_specs<char>_>::bin_writer<3>_>
  local_38;
  
  local_38.prefix.size_ = prefix.size_;
  local_38.prefix.data_ = prefix.data_;
  uVar1 = num_digits + local_38.prefix.size_;
  local_38.fill = (char_type)(spec->super_align_spec).fill_;
  aVar2 = (spec->super_align_spec).align_;
  if (aVar2 == ALIGN_NUMERIC) {
    uVar4 = (ulong)(spec->super_align_spec).width_;
    size = uVar4;
    if (uVar4 < uVar1) {
      size = uVar1;
    }
    local_38.padding = 0;
    if (uVar1 <= uVar4) {
      local_38.padding = uVar4 - uVar1;
    }
  }
  else {
    iVar3 = spec->precision_;
    if ((int)num_digits < iVar3) {
      local_38.fill = '0';
      local_38.padding = (long)iVar3 - (ulong)num_digits;
      size = (long)iVar3 + local_38.prefix.size_;
    }
    else {
      local_38.padding = 0;
      size = uVar1;
    }
  }
  local_48.align_ = (spec->super_align_spec).align_;
  local_48.width_ = (spec->super_align_spec).width_;
  local_48.fill_ = (spec->super_align_spec).fill_;
  if (aVar2 == ALIGN_DEFAULT) {
    local_48.align_ = ALIGN_RIGHT;
  }
  local_38.f = f;
  write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>::int_writer<unsigned_int,fmt::v5::basic_format_specs<char>>::bin_writer<3>>>
            (this,size,&local_48,&local_38);
  return;
}

Assistant:

void write_int(unsigned num_digits, string_view prefix,
                 const Spec &spec, F f) {
    std::size_t size = prefix.size() + num_digits;
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = 0;
    if (spec.align() == ALIGN_NUMERIC) {
      if (spec.width() > size) {
        padding = spec.width() - size;
        size = spec.width();
      }
    } else if (spec.precision() > static_cast<int>(num_digits)) {
      size = prefix.size() + static_cast<std::size_t>(spec.precision());
      padding = static_cast<std::size_t>(spec.precision()) - num_digits;
      fill = '0';
    }
    align_spec as = spec;
    if (spec.align() == ALIGN_DEFAULT)
      as.align_ = ALIGN_RIGHT;
    write_padded(size, as, padded_int_writer<F>{prefix, fill, padding, f});
  }